

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_proxy.c
# Opt level: O0

char * msg_type(uchar *msg,size_t len)

{
  size_t len_local;
  uchar *msg_local;
  
  if (len == 0) {
    msg_local = "Invalid";
  }
  else {
    switch(*msg) {
    case '\x14':
      msg_local = "ChangeCipherSpec";
      break;
    case '\x15':
      msg_local = "Alert";
      break;
    case '\x16':
      if (len < 0x19) {
        msg_local = "Invalid handshake";
      }
      else if (((msg[0xe] == '\0') && (msg[0x13] == '\0')) && (msg[0x16] == '\0')) {
        switch(msg[0xd]) {
        case '\0':
          msg_local = "HelloRequest";
          break;
        case '\x01':
          msg_local = "ClientHello";
          break;
        case '\x02':
          msg_local = "ServerHello";
          break;
        case '\x03':
          msg_local = "HelloVerifyRequest";
          break;
        case '\x04':
          msg_local = "NewSessionTicket";
          break;
        default:
          msg_local = "Unknown handshake";
          break;
        case '\v':
          msg_local = "Certificate";
          break;
        case '\f':
          msg_local = "ServerKeyExchange";
          break;
        case '\r':
          msg_local = "CertificateRequest";
          break;
        case '\x0e':
          msg_local = "ServerHelloDone";
          break;
        case '\x0f':
          msg_local = "CertificateVerify";
          break;
        case '\x10':
          msg_local = "ClientKeyExchange";
          break;
        case '\x14':
          msg_local = "Finished";
        }
      }
      else {
        msg_local = "Encrypted handshake";
      }
      break;
    case '\x17':
      msg_local = "ApplicationData";
      break;
    default:
      msg_local = "Unknown";
    }
  }
  return (char *)msg_local;
}

Assistant:

static const char *msg_type( unsigned char *msg, size_t len )
{
    if( len < 1 )                           return( "Invalid" );
    switch( msg[0] )
    {
        case MBEDTLS_SSL_MSG_CHANGE_CIPHER_SPEC:    return( "ChangeCipherSpec" );
        case MBEDTLS_SSL_MSG_ALERT:                 return( "Alert" );
        case MBEDTLS_SSL_MSG_APPLICATION_DATA:      return( "ApplicationData" );
        case MBEDTLS_SSL_MSG_HANDSHAKE:             break; /* See below */
        default:                            return( "Unknown" );
    }

    if( len < 13 + 12 )                     return( "Invalid handshake" );

    /*
     * Our handshake message are less than 2^16 bytes long, so they should
     * have 0 as the first byte of length, frag_offset and frag_length.
     * Otherwise, assume they are encrypted.
     */
    if( msg[14] || msg[19] || msg[22] )     return( "Encrypted handshake" );

    switch( msg[13] )
    {
        case MBEDTLS_SSL_HS_HELLO_REQUEST:          return( "HelloRequest" );
        case MBEDTLS_SSL_HS_CLIENT_HELLO:           return( "ClientHello" );
        case MBEDTLS_SSL_HS_SERVER_HELLO:           return( "ServerHello" );
        case MBEDTLS_SSL_HS_HELLO_VERIFY_REQUEST:   return( "HelloVerifyRequest" );
        case MBEDTLS_SSL_HS_NEW_SESSION_TICKET:     return( "NewSessionTicket" );
        case MBEDTLS_SSL_HS_CERTIFICATE:            return( "Certificate" );
        case MBEDTLS_SSL_HS_SERVER_KEY_EXCHANGE:    return( "ServerKeyExchange" );
        case MBEDTLS_SSL_HS_CERTIFICATE_REQUEST:    return( "CertificateRequest" );
        case MBEDTLS_SSL_HS_SERVER_HELLO_DONE:      return( "ServerHelloDone" );
        case MBEDTLS_SSL_HS_CERTIFICATE_VERIFY:     return( "CertificateVerify" );
        case MBEDTLS_SSL_HS_CLIENT_KEY_EXCHANGE:    return( "ClientKeyExchange" );
        case MBEDTLS_SSL_HS_FINISHED:               return( "Finished" );
        default:                            return( "Unknown handshake" );
    }
}